

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.h
# Opt level: O1

void __thiscall
Liby::BinaryHeap<Liby::WeakTimerHolder>::delete_min(BinaryHeap<Liby::WeakTimerHolder> *this)

{
  _Atomic_word *p_Var1;
  BasicHandler *__x;
  pointer pWVar2;
  pointer pWVar3;
  __suseconds_t _Var4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  _Any_data _Stack_50;
  code *pcStack_40;
  undefined8 local_38;
  __weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  uVar6 = (ulong)this->size_;
  if (uVar6 != 0) {
    this->size_ = this->size_ - 1;
    pWVar2 = (this->heap).
             super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __x = &pWVar2[uVar6].timer_.handler_;
    pWVar2[1].timer_.id_ = *(uint64_t *)((long)(__x + -1) + 8);
    _Var4 = *(__suseconds_t *)((long)(__x + -1) + 0x18);
    pWVar2[1].timer_.timeout_.tv_.tv_sec = *(__time_t *)((long)(__x + -1) + 0x10);
    pWVar2[1].timer_.timeout_.tv_.tv_usec = _Var4;
    std::function<void_()>::operator=(&pWVar2[1].timer_.handler_,__x);
    pWVar2[1].weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(__x + 1);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&pWVar2[1].weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &pWVar2[uVar6].weakTimerPtr_.
                super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    percolate_down(this,1);
    _Stack_30._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38 = 0;
    _Stack_30._M_ptr = (element_type *)0x0;
    _Stack_50._8_8_ = 0;
    pcStack_40 = (code *)0x0;
    _Stack_50._M_unused._M_object = (void *)0x0;
    uVar8 = this->size_ + 1;
    pWVar3 = (this->heap).
             super__Vector_base<Liby::WeakTimerHolder,_std::allocator<Liby::WeakTimerHolder>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pWVar2 = pWVar3 + uVar8;
    (pWVar2->timer_).id_ = 0;
    (pWVar2->timer_).timeout_.tv_.tv_sec = 0;
    (pWVar2->timer_).timeout_.tv_.tv_usec = 0;
    std::function<void_()>::operator=(&(pWVar2->timer_).handler_,(function<void_()> *)&_Stack_50);
    std::__weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&pWVar3[uVar8].weakTimerPtr_.
                super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>,&_Stack_30);
    if (_Stack_30._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(_Stack_30._M_refcount._M_pi)->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = (_Stack_30._M_refcount._M_pi)->_M_weak_count;
        (_Stack_30._M_refcount._M_pi)->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(_Stack_30._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (pcStack_40 != (code *)0x0) {
      (*pcStack_40)(&_Stack_50,&_Stack_50,__destroy_functor);
    }
    return;
  }
  uVar7 = __cxa_rethrow();
  __clang_call_terminate(uVar7);
}

Assistant:

bool empty() const { return size_ == 0; }